

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int make_var_live(gen_ctx_t gen_ctx,MIR_reg_t var,int scan_var,int point,int insn_p)

{
  VARR_live_range_t *varr;
  int iVar1;
  live_range_t_conflict plVar2;
  live_range_t_conflict lr;
  int insn_p_local;
  int point_local;
  int scan_var_local;
  MIR_reg_t var_local;
  gen_ctx_t gen_ctx_local;
  
  plVar2 = VARR_live_range_tget(gen_ctx->lr_ctx->var_live_ranges,(ulong)var);
  if ((insn_p != 0) && (gen_ctx->lr_ctx->scan_vars_num == 0)) {
    bitmap_set_bit_p(gen_ctx->lr_ctx->referenced_vars,(ulong)var);
  }
  iVar1 = bitmap_set_bit_p(gen_ctx->lr_ctx->live_vars,(long)scan_var);
  if (iVar1 == 0) {
    gen_ctx_local._4_4_ = 0;
  }
  else {
    if ((((insn_p == 0) || (plVar2 == (live_range_t_conflict)0x0)) ||
        (plVar2->lr_bb != (lr_bb_t_conflict)0x0)) ||
       ((plVar2->finish != point && (plVar2->finish + 1 != point)))) {
      varr = gen_ctx->lr_ctx->var_live_ranges;
      plVar2 = create_live_range(gen_ctx,point,-1,plVar2);
      VARR_live_range_tset(varr,(ulong)var,plVar2);
    }
    gen_ctx_local._4_4_ = 1;
  }
  return gen_ctx_local._4_4_;
}

Assistant:

static inline int make_var_live (gen_ctx_t gen_ctx, MIR_reg_t var, int scan_var, int point,
                                 int insn_p) {
  live_range_t lr;
  lr = VARR_GET (live_range_t, var_live_ranges, var);
  if (insn_p && scan_vars_num == 0) bitmap_set_bit_p (referenced_vars, var);
  if (!bitmap_set_bit_p (live_vars, scan_var)) return FALSE;
  /* Always start new live range for starting living at bb end or if
     the last live range is covering a whole bb: */
  if (!insn_p || lr == NULL || lr->lr_bb != NULL
      || (lr->finish != point && lr->finish + 1 != point)) {
    VARR_SET (live_range_t, var_live_ranges, var, create_live_range (gen_ctx, point, -1, lr));
  }
  return TRUE;
}